

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O2

void __thiscall
test_suite::detail::simple_runner::fail
          (simple_runner *this,char *expr,char *file,int line,char *param_4)

{
  atomic<unsigned_long> *paVar1;
  ostream *poVar2;
  char *pcVar3;
  
  LOCK();
  paVar1 = &(this->all_).failed;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->v_).
            super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].total;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->v_).
            super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].failed;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->all_).total;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  poVar2 = std::operator<<(this->log_,"#");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  pcVar3 = filename(this,file);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
  poVar2 = std::operator<<(poVar2,") failed: ");
  poVar2 = std::operator<<(poVar2,expr);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void
  fail(
      char const* expr,
      char const* file,
      int line,
      char const*) override
  {
    ++all_.failed;
    ++v_.back().total;
    ++v_.back().failed;
    auto const id = ++all_.total;
    log_ <<
         "#" << id <<
         " " << filename(file) <<
         "(" << line << ") "
                        "failed: " << expr << "\n";
  }